

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void test_fs_partial(int doread)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uv_buf_t *bufs;
  char *__s1;
  uv_loop_t *puVar4;
  long lVar5;
  ulong uVar6;
  size_t *psVar7;
  long lVar8;
  uv_buf_t *bufs_00;
  char *base;
  uv_buf_t uVar9;
  int pipe_fds [2];
  thread_ctx_conflict ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  uv_file local_100 [2];
  pthread_t local_f8;
  uv_file local_f0;
  void *local_e8;
  undefined8 local_e0;
  int local_d8;
  uv_thread_t local_d0;
  uv_signal_t local_c8;
  
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_00156b12:
    test_fs_partial_cold_17();
LAB_00156b17:
    test_fs_partial_cold_16();
LAB_00156b1c:
    test_fs_partial_cold_15();
LAB_00156b21:
    test_fs_partial_cold_1();
LAB_00156b26:
    test_fs_partial_cold_2();
LAB_00156b2b:
    test_fs_partial_cold_3();
LAB_00156b30:
    test_fs_partial_cold_4();
LAB_00156b35:
    test_fs_partial_cold_8();
LAB_00156b3a:
    test_fs_partial_cold_9();
LAB_00156b3f:
    test_fs_partial_cold_10();
LAB_00156b44:
    test_fs_partial_cold_11();
LAB_00156b49:
    test_fs_partial_cold_12();
LAB_00156b4e:
    test_fs_partial_cold_13();
LAB_00156b53:
    test_fs_partial_cold_14();
  }
  else {
    local_f8 = pthread_self();
    local_e0 = 0x3e8000ac67d;
    local_d8 = doread;
    local_e8 = malloc(0xac67d);
    if (local_e8 == (void *)0x0) goto LAB_00156b17;
    __s1 = (char *)malloc(0xac67d);
    if (__s1 == (char *)0x0) goto LAB_00156b1c;
    lVar8 = 8;
    base = __s1;
    do {
      uVar9 = uv_buf_init(base,0xd);
      *(char **)((long)bufs + lVar8 + -8) = uVar9.base;
      *(size_t *)((long)&bufs->base + lVar8) = uVar9.len;
      lVar8 = lVar8 + 0x10;
      base = base + 0xd;
    } while (lVar8 != 0xd4318);
    loop = uv_default_loop();
    iVar2 = uv_signal_init(loop,&local_c8);
    if (iVar2 != 0) goto LAB_00156b21;
    iVar2 = uv_signal_start(&local_c8,sig_func,10);
    if (iVar2 != 0) goto LAB_00156b26;
    iVar2 = pipe(local_100);
    if (iVar2 != 0) goto LAB_00156b2b;
    local_f0 = local_100[(uint)doread];
    iVar2 = uv_thread_create(&local_d0,thread_main,&local_f8);
    if (iVar2 != 0) goto LAB_00156b30;
    if (doread != 0) {
      if (0 < (int)local_e0) {
        iVar2 = 0;
        lVar8 = 0xd431;
        bufs_00 = bufs;
        do {
          uVar3 = uv_fs_read(loop,&read_req,local_100[0],bufs_00,(uint)lVar8,-1,(uv_fs_cb)0x0);
          if ((int)uVar3 < 1) {
            if (uVar3 != 0xfffffffc) {
              test_fs_partial_cold_5();
              goto LAB_00156b12;
            }
          }
          else {
            uVar6 = (ulong)uVar3;
            psVar7 = &bufs_00->len;
            lVar5 = 0;
            do {
              uVar1 = *psVar7;
              if (uVar6 <= uVar1 && uVar1 - uVar6 != 0) {
                ((uv_buf_t *)(psVar7 + -1))->base = ((uv_buf_t *)(psVar7 + -1))->base + uVar6;
                *psVar7 = uVar1 - uVar6;
                break;
              }
              lVar5 = lVar5 + 1;
              psVar7 = psVar7 + 2;
              uVar6 = uVar6 - uVar1;
            } while (uVar6 != 0);
            lVar8 = lVar8 - lVar5;
            bufs_00 = bufs_00 + lVar5;
            iVar2 = iVar2 + uVar3;
          }
          uv_fs_req_cleanup(&read_req);
        } while (iVar2 < (int)local_e0);
      }
LAB_001569fc:
      iVar2 = bcmp(__s1,local_e8,(long)(int)local_e0);
      if (iVar2 != 0) goto LAB_00156b35;
      iVar2 = uv_thread_join(&local_d0);
      if (iVar2 != 0) goto LAB_00156b3a;
      iVar2 = uv_run(loop,UV_RUN_DEFAULT);
      if (iVar2 != 0) goto LAB_00156b3f;
      iVar2 = close(local_100[1]);
      if (iVar2 != 0) goto LAB_00156b44;
      uv_close((uv_handle_t *)&local_c8,(uv_close_cb)0x0);
      iVar2 = uv_fs_read(loop,&read_req,local_100[0],bufs,1,-1,(uv_fs_cb)0x0);
      if (iVar2 != 0) goto LAB_00156b49;
      uv_fs_req_cleanup(&read_req);
      iVar2 = close(local_100[0]);
      if (iVar2 != 0) goto LAB_00156b4e;
      free(bufs);
      free(__s1);
      free(local_e8);
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00156b53;
    }
    iVar2 = uv_fs_write(loop,&write_req,local_100[1],bufs,0xd431,-1,(uv_fs_cb)0x0);
    if (write_req.result == iVar2) {
      if (iVar2 != (int)local_e0) goto LAB_00156b5d;
      uv_fs_req_cleanup(&write_req);
      goto LAB_001569fc;
    }
  }
  test_fs_partial_cold_6();
LAB_00156b5d:
  test_fs_partial_cold_7();
  test_fs_partial(0);
  return;
}

Assistant:

static void test_fs_partial(int doread) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int pipe_fds[2];
  size_t iovcount;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;

  iovcount = 54321;

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);

  ctx.pid = pthread_self();
  ctx.doread = doread;
  ctx.interval = 1000;
  ctx.size = sizeof(test_buf) * iovcount;
  ctx.data = malloc(ctx.size);
  ASSERT(ctx.data != NULL);
  buffer = malloc(ctx.size);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf), sizeof(test_buf));

  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));

  ctx.fd = pipe_fds[doread];
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  if (doread) {
    uv_buf_t* read_iovs;
    int nread;
    read_iovs = iovs;
    nread = 0;
    while (nread < ctx.size) {
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], read_iovs, iovcount, -1, NULL);
      if (result > 0) {
        size_t read_iovcount;
        read_iovcount = uv_test_fs_buf_offset(read_iovs, result);
        read_iovs += read_iovcount;
        iovcount -= read_iovcount;
        nread += result;
      } else {
        ASSERT(result == UV_EINTR);
      }
      uv_fs_req_cleanup(&read_req);
    }
  } else {
    int result;
    result = uv_fs_write(loop, &write_req, pipe_fds[1], iovs, iovcount, -1, NULL);
    ASSERT(write_req.result == result);
    ASSERT(result == ctx.size);
    uv_fs_req_cleanup(&write_req);
  }

  ASSERT(0 == memcmp(buffer, ctx.data, ctx.size));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  { /* Make sure we read everything that we wrote. */
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], iovs, 1, -1, NULL);
      ASSERT(result == 0);
      uv_fs_req_cleanup(&read_req);
  }
  ASSERT(0 == close(pipe_fds[0]));

  free(iovs);
  free(buffer);
  free(ctx.data);

  MAKE_VALGRIND_HAPPY();
}